

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O1

double log(double __x)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Rb_tree_node_base *p_Var3;
  long in_RDI;
  double extraout_XMM0_Qa;
  Set<std::shared_ptr<LogOutput>_> logs;
  _Rb_tree<std::shared_ptr<LogOutput>,_std::shared_ptr<LogOutput>,_std::_Identity<std::shared_ptr<LogOutput>_>,_std::less<std::shared_ptr<LogOutput>_>,_std::allocator<std::shared_ptr<LogOutput>_>_>
  _Stack_48;
  
  p_Var1 = &_Stack_48._M_impl.super__Rb_tree_header;
  _Stack_48._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_48._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_48._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_48._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  _Stack_48._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&sOutputsMutex);
  if (iVar2 == 0) {
    std::
    _Rb_tree<std::shared_ptr<LogOutput>,_std::shared_ptr<LogOutput>,_std::_Identity<std::shared_ptr<LogOutput>_>,_std::less<std::shared_ptr<LogOutput>_>,_std::allocator<std::shared_ptr<LogOutput>_>_>
    ::operator=(&_Stack_48,
                (_Rb_tree<std::shared_ptr<LogOutput>,_std::shared_ptr<LogOutput>,_std::_Identity<std::shared_ptr<LogOutput>_>,_std::less<std::shared_ptr<LogOutput>_>,_std::allocator<std::shared_ptr<LogOutput>_>_>
                 *)&sOutputs);
    pthread_mutex_unlock((pthread_mutex_t *)&sOutputsMutex);
    p_Var3 = _Stack_48._M_impl.super__Rb_tree_header._M_header._M_left;
    while( true ) {
      if ((_Rb_tree_header *)p_Var3 == p_Var1) {
        std::
        _Rb_tree<std::shared_ptr<LogOutput>,_std::shared_ptr<LogOutput>,_std::_Identity<std::shared_ptr<LogOutput>_>,_std::less<std::shared_ptr<LogOutput>_>,_std::allocator<std::shared_ptr<LogOutput>_>_>
        ::~_Rb_tree(&_Stack_48);
        return extraout_XMM0_Qa;
      }
      if (*(long *)(in_RDI + 0x10) == 0) break;
      (**(code **)(in_RDI + 0x18))();
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    }
    iVar2 = std::__throw_bad_function_call();
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void log(const std::function<void(const std::shared_ptr<LogOutput> &)> &func)
{
    Set<std::shared_ptr<LogOutput> > logs;
    {
        std::lock_guard<std::mutex> lock(sOutputsMutex);
        logs = sOutputs;
    }
    for (const auto &out : logs) {
        func(out);
    }
}